

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O0

string * __thiscall
CLI::getSubCommand(string *__return_storage_ptr__,CLI *this,
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *subCommands,string *defaultCommand)

{
  ulong uVar1;
  string *local_78;
  string local_50;
  string *local_30;
  string *subCommand;
  string *defaultCommand_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *subCommands_local;
  CLI *this_local;
  
  subCommand = defaultCommand;
  defaultCommand_local = (string *)subCommands;
  subCommands_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (CLI *)__return_storage_ptr__;
  findSubCommand(&local_50,this,subCommands);
  local_30 = &local_50;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_78 = local_30;
  }
  else {
    local_78 = subCommand;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_78);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string CLI::getSubCommand(const std::set<std::string>& subCommands, const std::string& defaultCommand) {
  const auto& subCommand = findSubCommand (subCommands);

  return subCommand.empty () ? defaultCommand : subCommand;
}